

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O1

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined4 uVar18;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined8 uVar26;
  bool bVar33;
  bool bVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  ulong uVar42;
  int iVar43;
  uint uVar44;
  Allocator *pAVar45;
  int iVar46;
  Allocator *pAVar47;
  long lVar48;
  bool bVar49;
  bool bVar50;
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  int local_118;
  int _outc;
  int _outd;
  int _hoffset;
  Mat m_1;
  int _coffset;
  size_t local_a8;
  ulong local_a0;
  Mat m_2;
  int _doffset;
  Crop_x86 *local_38;
  undefined4 uVar12;
  undefined3 uVar14;
  undefined2 uVar16;
  undefined4 uVar20;
  undefined3 uVar22;
  undefined2 uVar24;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined3 uVar29;
  undefined1 uVar30;
  undefined2 uVar31;
  undefined1 uVar32;
  
  iVar37 = bottom_blob->elempack;
  if (iVar37 != 4) goto LAB_00296458;
  iVar1 = bottom_blob->w;
  local_118 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  iVar3 = bottom_blob->c;
  uVar44 = bottom_blob->dims;
  local_a0 = (ulong)uVar44;
  if (uVar44 - 1 < 4) {
    lVar38 = (long)iVar1;
    m.w = iVar1;
    switch(uVar44) {
    case 1:
      m.w = iVar1 * 4;
      m.dims = 1;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      m.cstep = (size_t)m.w;
      goto LAB_002953d4;
    case 2:
      m.h = local_118 * 4;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 2;
      m.d = 1;
      m.c = 1;
      m.cstep = m.h * lVar38;
      goto LAB_00295453;
    case 3:
      m.dims = 3;
      m.d = 1;
      lVar38 = local_118 * lVar38;
      break;
    case 4:
      m.dims = 4;
      lVar38 = local_118 * lVar38 * (long)iVar2;
      m.d = iVar2;
    }
    m.c = iVar3 * 4;
    m.cstep = lVar38 + 3U & 0x3ffffffffffffffc;
    m.h = local_118;
LAB_002953d4:
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
  }
  else {
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
LAB_00295453:
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  local_a8 = bottom_blob->elemsize;
  pAVar45 = (Allocator *)&_doffset;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&m,&_woffset,
             &_hoffset,(int *)pAVar45,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar36 = (int)local_a0;
  iVar43 = iVar3;
  local_38 = this;
  if (iVar36 == 1) {
    uVar44 = _outw & 3;
    iVar46 = (uint)(uVar44 == 0) * 3 + 1;
    iVar36 = _outw / iVar46;
    if (iVar36 == iVar1 && uVar44 == 0) {
      if (top_blob != bottom_blob) {
        piVar4 = bottom_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = top_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar4 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar4;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar43 = bottom_blob->w;
        iVar36 = bottom_blob->h;
        iVar46 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar43;
        top_blob->h = iVar36;
        top_blob->d = iVar46;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
LAB_0029563c:
      bVar49 = false;
      iVar43 = 0;
    }
    else if (((_outw | _woffset) & 3U) == 0) {
      pAVar45 = opt->blob_allocator;
      Mat::create(top_blob,iVar36,(local_a8 >> 2) << (uVar44 == 0) * '\x02',iVar46,pAVar45);
      iVar43 = -100;
      if (top_blob->data == (void *)0x0) {
        bVar49 = false;
      }
      else {
        bVar49 = false;
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar43 = _woffset + 3;
          if (-1 < _woffset) {
            iVar43 = _woffset;
          }
          crop_pack4_sse(bottom_blob,top_blob,0,iVar43 >> 2);
          goto LAB_0029563c;
        }
      }
    }
    else {
      bVar49 = true;
    }
    if (bVar49) {
      iVar36 = (int)local_a0;
      goto LAB_0029564e;
    }
LAB_00296445:
    bVar49 = false;
  }
  else {
LAB_0029564e:
    iVar46 = local_118;
    if (iVar36 == 2) {
      bVar49 = (_outh & 3U) == 0;
      iVar36 = (uint)bVar49 * 3 + 1;
      pAVar45 = (Allocator *)0x0;
      if (_outw == iVar1) {
        if (((_outh & 3U) != 0) || (_outh / iVar36 != local_118)) goto LAB_002956eb;
        if (top_blob != bottom_blob) {
          piVar4 = bottom_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = top_blob->data;
              pAVar47 = top_blob->allocator;
              if (pAVar47 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar47->_vptr_Allocator[3])
                          (pAVar47,pvVar5,(long)_outh % (long)iVar36 & 0xffffffff);
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar4 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar4;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar43 = bottom_blob->w;
          iVar36 = bottom_blob->h;
          iVar35 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar43;
          top_blob->h = iVar36;
          top_blob->d = iVar35;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar33 = false;
        iVar43 = 0;
      }
      else {
LAB_002956eb:
        bVar33 = true;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh / iVar36,(local_a8 >> 2) << bVar49 * '\x02',iVar36,
                      opt->blob_allocator);
          iVar43 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            iVar43 = _hoffset + 3;
            if (-1 < _hoffset) {
              iVar43 = _hoffset;
            }
            crop_pack4_sse(bottom_blob,top_blob,iVar43 >> 2,_woffset);
            iVar43 = 0;
          }
          bVar33 = false;
        }
      }
      if (!bVar33) goto LAB_00296445;
    }
    iVar36 = (int)local_a0;
    if (iVar36 == 3) {
      bVar49 = (_outc & 3U) == 0;
      iVar36 = (uint)bVar49 * 3 + 1;
      pAVar47 = (Allocator *)((local_a8 >> 2) << bVar49 * '\x02');
      bVar49 = _outh != iVar46 || _outw != iVar1;
      if (bVar49) {
LAB_0029587b:
        bVar33 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar36;
          m.w = bottom_blob->w;
          pAVar45 = (Allocator *)(long)m.w;
          m.h = bottom_blob->h;
          uVar42 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset / iVar36) * bottom_blob->cstep * uVar42 +
                           (long)bottom_blob->data);
          m.d = bottom_blob->d;
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar42;
          m.elemsize._4_4_ = (undefined4)(uVar42 >> 0x20);
          uVar39 = (long)m.d * uVar42 * (long)m.h * (long)pAVar45 + 0xf & 0xfffffffffffffff0;
          m.cstep = uVar39 / uVar42;
          m.dims = bottom_blob->dims;
          if (bVar49) {
LAB_00295ad8:
            Mat::create(top_blob,_outw,_outh,_outc / iVar36,(size_t)pAVar47,iVar36,
                        opt->blob_allocator);
            iVar43 = -100;
            pAVar45 = pAVar47;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar43 = 0;
              }
              else {
                lVar38 = 0;
                do {
                  uVar42 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  m_1.data = (void *)(m.cstep * lVar38 * uVar42 + (long)m.data);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = m.d;
                  m_1.w = m.w;
                  m_1.dims = m.dims + -1;
                  m_1.cstep = (uVar42 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar42;
                  if (m.dims == 4) {
                    m_1.cstep = (long)m.h * (long)m.w;
                  }
                  m_2.h = top_blob->h;
                  m_2.c = top_blob->d;
                  uVar42 = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar38 * uVar42 + (long)top_blob->data);
                  m_2.elempack = top_blob->elempack;
                  pAVar45 = (Allocator *)(ulong)(uint)m_2.elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar42;
                  m_2.elemsize._4_4_ = (undefined4)(uVar42 >> 0x20);
                  m_2.d = 1;
                  sVar40 = (long)m_2.h * (long)top_blob->w;
                  m_2.w = top_blob->w;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (uVar42 * sVar40 + 0xf & 0xfffffffffffffff0) / uVar42;
                  if (top_blob->dims == 4) {
                    m_2.cstep = sVar40;
                  }
                  crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  lVar38 = lVar38 + 1;
                } while (lVar38 < top_blob->c);
                iVar43 = 0;
              }
            }
          }
          else {
            Mat::clone(&m_1,(__fn *)&m,(void *)0x0,(int)uVar39,pAVar45);
            if (&m_1 != top_blob) {
              piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = top_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data = m_1.data;
              top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
              top_blob->elempack = m_1.elempack;
              top_blob->allocator = m_1.allocator;
              top_blob->dims = m_1.dims;
              top_blob->w = m_1.w;
              top_blob->h = m_1.h;
              top_blob->d = m_1.d;
              top_blob->c = m_1.c;
              top_blob->cstep = m_1.cstep;
            }
            piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar43 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00295ad8;
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar33 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar36 != iVar3)) goto LAB_0029587b;
        if (top_blob != bottom_blob) {
          piVar4 = bottom_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = top_blob->data;
              pAVar47 = top_blob->allocator;
              if (pAVar47 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar47->_vptr_Allocator[3])
                          (pAVar47,pvVar5,(long)_outc % (long)iVar36 & 0xffffffff);
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar4 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar4;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar43 = bottom_blob->w;
          iVar36 = bottom_blob->h;
          iVar46 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar43;
          top_blob->h = iVar36;
          top_blob->d = iVar46;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar33 = false;
        iVar43 = 0;
      }
      if (!bVar33) goto LAB_00296445;
      iVar36 = (int)local_a0;
      iVar46 = local_118;
    }
    bVar49 = true;
    if (iVar36 == 4) {
      bVar50 = (_outc & 3U) == 0;
      iVar36 = (uint)bVar50 * 3 + 1;
      uVar42 = local_a8 >> 2;
      bVar33 = iVar2 == _outd;
      bVar34 = iVar46 == _outh && iVar1 == _outw;
      if (bVar33 && bVar34) {
        if (((_outc & 3U) == 0) && (_outc / iVar36 == iVar3)) {
          if (top_blob != bottom_blob) {
            piVar4 = bottom_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                pvVar5 = top_blob->data;
                pAVar45 = top_blob->allocator;
                if (pAVar45 == (Allocator *)0x0) {
                  if (pvVar5 != (void *)0x0) {
                    free(pvVar5);
                  }
                }
                else {
                  (*pAVar45->_vptr_Allocator[3])
                            (pAVar45,pvVar5,(long)_outc % (long)iVar36 & 0xffffffff);
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar4 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar4;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar1 = bottom_blob->w;
            iVar2 = bottom_blob->h;
            iVar3 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar1;
            top_blob->h = iVar2;
            top_blob->d = iVar3;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
          }
          bVar49 = false;
          iVar43 = 0;
          goto LAB_00296447;
        }
      }
      if (((_coffset | _outc) & 3U) == 0) {
        m.c = _outc / iVar36;
        m.w = bottom_blob->w;
        m.h = bottom_blob->h;
        uVar39 = bottom_blob->elemsize;
        m.data = (void *)((long)(_coffset / iVar36) * bottom_blob->cstep * uVar39 +
                         (long)bottom_blob->data);
        m.d = bottom_blob->d;
        m.elempack = bottom_blob->elempack;
        m.allocator = bottom_blob->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar39;
        m.elemsize._4_4_ = (undefined4)(uVar39 >> 0x20);
        uVar41 = (long)m.d * uVar39 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0;
        m.cstep = uVar41 / uVar39;
        m.dims = bottom_blob->dims;
        if (bVar33 && (iVar46 == _outh && iVar1 == _outw)) {
          Mat::clone(&m_1,(__fn *)&m,(void *)0x0,(int)uVar41,
                     (void *)CONCAT71((int7)((ulong)pAVar45 >> 8),bVar33 && bVar34));
          if (&m_1 != top_blob) {
            piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = m_1.data;
            top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
            top_blob->elempack = m_1.elempack;
            top_blob->allocator = m_1.allocator;
            top_blob->dims = m_1.dims;
            top_blob->w = m_1.w;
            top_blob->h = m_1.h;
            top_blob->d = m_1.d;
            top_blob->c = m_1.c;
            top_blob->cstep = m_1.cstep;
          }
          piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar43 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
          goto LAB_00296113;
        }
        else {
LAB_00296113:
          Mat::create(top_blob,_outw,_outh,_outd,_outc / iVar36,uVar42 << bVar50 * '\x02',iVar36,
                      opt->blob_allocator);
          iVar43 = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if (top_blob->c < 1) {
              iVar43 = 0;
            }
            else {
              lVar38 = 0;
              do {
                if (0 < _outd) {
                  lVar48 = 0;
                  do {
                    m_1.cstep = (long)m.h * (long)m.w;
                    m_1.data = (void *)((long)m.data +
                                       (long)(_doffset + (int)lVar48) *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) * m_1.cstep
                                       + m.cstep * lVar38 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize));
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                    m_1.elemsize._4_4_ = m.elemsize._4_4_;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.w = m.w;
                    m_1.dims = 2;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = 1;
                    m_2.h = top_blob->h;
                    sVar40 = top_blob->elemsize;
                    m_2.elempack = top_blob->elempack;
                    m_2.allocator = top_blob->allocator;
                    m_2.cstep = (long)m_2.h * (long)top_blob->w;
                    m_2.data = (void *)((long)top_blob->data +
                                       lVar48 * sVar40 * m_2.cstep +
                                       top_blob->cstep * lVar38 * sVar40);
                    m_2.refcount._0_4_ = 0;
                    m_2.refcount._4_4_ = 0;
                    m_2.elemsize._0_4_ = (undefined4)sVar40;
                    m_2.elemsize._4_4_ = (undefined4)(sVar40 >> 0x20);
                    m_2.w = top_blob->w;
                    m_2.dims = 2;
                    m_2.d = 1;
                    m_2.c = 1;
                    crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
                    piVar4 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (m_2.allocator == (Allocator *)0x0) {
                          if (m_2.data != (void *)0x0) {
                            free(m_2.data);
                          }
                        }
                        else {
                          (*(m_2.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_2.cstep = 0;
                    m_2.data = (void *)0x0;
                    m_2.refcount._0_4_ = 0;
                    m_2.refcount._4_4_ = 0;
                    m_2.elemsize._0_4_ = 0;
                    m_2.elemsize._4_4_ = 0;
                    m_2.elempack = 0;
                    m_2.dims = 0;
                    m_2.w = 0;
                    m_2.h = 0;
                    m_2.d = 0;
                    m_2.c = 0;
                    piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    lVar48 = lVar48 + 1;
                  } while (lVar48 < _outd);
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 < top_blob->c);
              iVar43 = 0;
            }
          }
        }
        piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_00296445;
      }
    }
  }
LAB_00296447:
  this = local_38;
  if (!bVar49) {
    return iVar43;
  }
LAB_00296458:
  m.data = bottom_blob->data;
  piVar4 = bottom_blob->refcount;
  m.refcount._0_4_ = SUB84(piVar4,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar6 = bottom_blob->dims;
  uVar7 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  uVar9 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  m.dims = uVar6;
  m.w = uVar7;
  m.h = uVar8;
  m.d = uVar9;
  if (iVar37 != 1) {
    m_1.data = *(void **)opt;
    uVar10 = opt->openmp_blocktime;
    uVar11 = opt->use_winograd_convolution;
    uVar13 = opt->use_sgemm_convolution;
    uVar15 = opt->use_int8_inference;
    uVar17 = opt->use_vulkan_compute;
    uVar16 = CONCAT11(uVar17,uVar15);
    uVar14 = CONCAT21(uVar16,uVar13);
    uVar12 = CONCAT31(uVar14,uVar11);
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar18 = opt->flush_denormals;
    uVar19 = opt->use_local_pool_allocator;
    uVar21 = opt->use_shader_local_memory;
    uVar23 = opt->use_cooperative_matrix;
    uVar25 = opt->use_winograd23_convolution;
    uVar24 = CONCAT11(uVar25,uVar23);
    uVar22 = CONCAT21(uVar24,uVar21);
    uVar20 = CONCAT31(uVar22,uVar19);
    uVar26._0_1_ = opt->use_winograd43_convolution;
    uVar26._1_1_ = opt->use_winograd63_convolution;
    uVar26._2_1_ = opt->use_reserved_6;
    uVar26._3_1_ = opt->use_reserved_7;
    uVar27 = opt->use_reserved_8;
    uVar28 = opt->use_reserved_9;
    uVar30 = opt->use_reserved_10;
    uVar32 = opt->use_reserved_11;
    uVar31 = CONCAT11(uVar32,uVar30);
    uVar29 = CONCAT21(uVar31,uVar28);
    uVar26._4_4_ = CONCAT31(uVar29,uVar27);
    m_1.c = (int)uVar26;
    m_1.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    m_1.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    m_1.elempack = uVar10;
    m_1._28_4_ = uVar12;
    m_1.h = uVar18;
    m_1.d = uVar20;
    m_1._60_4_ = uVar26._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar37 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&m,
                         top_blob,opt);
  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}